

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::SVQueue> * __thiscall
slang::CopyPtr<slang::SVQueue>::operator=
          (CopyPtr<slang::SVQueue> *this,CopyPtr<slang::SVQueue> *other)

{
  SVQueue *pSVar1;
  CopyPtr<slang::SVQueue> *in_RSI;
  CopyPtr<slang::SVQueue> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  SVQueue *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI->ptr;
    if (this_00 != (SVQueue *)0x0) {
      SVQueue::~SVQueue((SVQueue *)0x614bdc);
      operator_delete(this_00,in_stack_ffffffffffffffc8);
    }
    pSVar1 = (SVQueue *)operator_new(0x614bf5);
    SVQueue::SVQueue(this_00,pSVar1);
    in_RDI->ptr = pSVar1;
  }
  return in_RDI;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }